

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O0

_func_void_void_ptr * __thiscall
base::internal::HookList<void_(*)(const_void_*)>::ExchangeSingular
          (HookList<void_(*)(const_void_*)> *this,_func_void_void_ptr *value)

{
  SpinLockHolder SVar1;
  atomic<void_(*)(const_void_*)> *paVar2;
  SpinLockHolder local_48;
  SpinLockHolder l;
  _func_void_void_ptr *old_value;
  _func_void_void_ptr *value_local;
  HookList<void_(*)(const_void_*)> *this_local;
  memory_order __b;
  
  SpinLockHolder::SpinLockHolder(&local_48,(SpinLock *)&hooklist_spinlock);
  paVar2 = cast_priv_data(this,7);
  l.lock_ = (SpinLock *)std::atomic<void_(*)(const_void_*)>::load(paVar2,memory_order_relaxed);
  paVar2 = cast_priv_data(this,7);
  std::atomic<void_(*)(const_void_*)>::store(paVar2,value,memory_order_relaxed);
  if (value == (_func_void_void_ptr *)0x0) {
    FixupPrivEndLocked(this);
  }
  else {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (this->priv_end).super___atomic_base<unsigned_long>._M_i = 8;
  }
  SVar1.lock_ = l.lock_;
  SpinLockHolder::~SpinLockHolder(&local_48);
  return (_func_void_void_ptr *)SVar1.lock_;
}

Assistant:

T HookList<T>::ExchangeSingular(T value) {
  T old_value;
  SpinLockHolder l(&hooklist_spinlock);
  old_value = cast_priv_data(kHookListSingularIdx)->load(std::memory_order_relaxed);
  cast_priv_data(kHookListSingularIdx)->store(value, std::memory_order_relaxed);
  if (value != T{}) {
    priv_end.store(kHookListSingularIdx + 1, std::memory_order_relaxed);
  } else {
    FixupPrivEndLocked();
  }
  return old_value;
}